

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O0

Errors * anon_unknown.dwarf_a364c::ParseInvalidModule(Errors *__return_storage_ptr__,string *text)

{
  bool bVar1;
  size_t size;
  Errors *errors_00;
  pointer lexer_00;
  char *message;
  string_view filename;
  AssertHelper local_98;
  Message local_90;
  Enum local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  undefined1 local_65;
  Result result;
  WastParseOptions options;
  Features features;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  char *local_30;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> local_28;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  string *text_local;
  Errors *errors;
  
  lexer._M_t.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
  super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl._7_1_ = 0;
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector(__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&module,"test");
  size = std::__cxx11::string::c_str();
  errors_00 = (Errors *)std::__cxx11::string::size();
  filename._M_str =
       (char *)module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
               super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl;
  filename._M_len = (size_t)&local_28;
  wabt::WastLexer::CreateBufferLexer(filename,local_30,size,errors_00);
  std::unique_ptr<wabt::Module,std::default_delete<wabt::Module>>::
  unique_ptr<std::default_delete<wabt::Module>,void>
            ((unique_ptr<wabt::Module,std::default_delete<wabt::Module>> *)
             &features.reference_types_enabled_);
  wabt::Features::Features((Features *)&options.features.annotations_enabled_);
  wabt::WastParseOptions::WastParseOptions
            ((WastParseOptions *)&local_65,(Features *)&options.features.annotations_enabled_);
  lexer_00 = std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::get(&local_28)
  ;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ =
       wabt::ParseWatModule
                 (lexer_00,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                           &features.reference_types_enabled_,__return_storage_ptr__,
                  (WastParseOptions *)&local_65);
  local_84 = Error;
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_80,"Result::Error","result",&local_84,
             (Result *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-wast-parser.cc"
               ,0x2c,message);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  lexer._M_t.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
  super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl._7_1_ = 1;
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
             &features.reference_types_enabled_);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&local_28);
  if ((lexer._M_t.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t
       .super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
       super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl._7_1_ & 1) == 0) {
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Errors ParseInvalidModule(std::string text) {
  Errors errors;
  auto lexer =
      WastLexer::CreateBufferLexer("test", text.c_str(), text.size(), &errors);
  std::unique_ptr<Module> module;
  Features features;
  WastParseOptions options(features);
  Result result = ParseWatModule(lexer.get(), &module, &errors, &options);
  EXPECT_EQ(Result::Error, result);

  return errors;
}